

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Map::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator[](Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int *key)

{
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar1;
  Iterator IVar2;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_48 [16];
  Iterator local_38;
  
  local_70[0] = 0;
  local_60._0_4_ = *key;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_70,local_70);
  IVar2 = BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::search(&this->tree,
                   (Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (IVar2.node_ptr ==
      (BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_70[0] = 0;
    local_60._0_4_ = *key;
    local_58._M_p = local_48;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_70,local_70);
    BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->tree,
             (Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_60);
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
  }
  local_70[0] = 0;
  local_60._0_4_ = *key;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_70,local_70);
  local_38 = BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::search(&this->tree,
                      (Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_60);
  pPVar1 = BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::Iterator::operator->(&local_38);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  return &pPVar1->value;
}

Assistant:

T& Map<Key, T>::operator[](const Key& key) {
    if (tree.search(Pair<Key, T>(key, T())) == nullptr)
        tree.insert(Pair<Key, T>(key, T()));
    return tree.search(Pair<Key, T>(key, T()))->value;
}